

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

uint16_t __thiscall capnp::DynamicEnum::asImpl(DynamicEnum *this,uint64_t requestedTypeId)

{
  uint64_t requestedTypeId_local;
  DebugComparison<unsigned_long_&,_unsigned_long> _kjCondition;
  Fault f;
  uint64_t *local_38;
  uint local_28;
  
  requestedTypeId_local = requestedTypeId;
  Schema::getProto((Reader *)&f,(Schema *)this);
  if (local_28 < 0x40) {
    _kjCondition.right = 0;
  }
  else {
    _kjCondition.right = *local_38;
  }
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == requestedTypeId;
  if (!_kjCondition.result) {
    _kjCondition.left = &requestedTypeId_local;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long>&,char_const(&)[35]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x78,FAILED,"requestedTypeId == schema.getProto().getId()",
               "_kjCondition,\"Type mismatch in DynamicEnum.as().\"",&_kjCondition,
               (char (*) [35])"Type mismatch in DynamicEnum.as().");
    kj::_::Debug::Fault::~Fault(&f);
  }
  return this->value;
}

Assistant:

uint16_t DynamicEnum::asImpl(uint64_t requestedTypeId) const {
  KJ_REQUIRE(requestedTypeId == schema.getProto().getId(),
             "Type mismatch in DynamicEnum.as().") {
    // use it anyway
    break;
  }
  return value;
}